

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O0

int nghttp2_frame_pack_origin(nghttp2_bufs *bufs,nghttp2_extension *frame)

{
  ulong *puVar1;
  nghttp2_buf_chain *pnVar2;
  undefined8 *puVar3;
  uint8_t *puVar4;
  ulong local_40;
  size_t i;
  nghttp2_origin_entry *orig;
  nghttp2_ext_origin *origin;
  nghttp2_buf *buf;
  nghttp2_extension *frame_local;
  nghttp2_bufs *bufs_local;
  
  puVar1 = (ulong *)frame->payload;
  pnVar2 = bufs->head;
  if ((ulong)((long)(pnVar2->buf).end - (long)(pnVar2->buf).last) < (frame->hd).length) {
    bufs_local._4_4_ = -0x20a;
  }
  else {
    (pnVar2->buf).pos = (pnVar2->buf).pos + -9;
    nghttp2_frame_pack_frame_hd((pnVar2->buf).pos,&frame->hd);
    for (local_40 = 0; local_40 < *puVar1; local_40 = local_40 + 1) {
      puVar3 = (undefined8 *)(puVar1[1] + local_40 * 0x10);
      nghttp2_put_uint16be((pnVar2->buf).last,(uint16_t)puVar3[1]);
      (pnVar2->buf).last = (pnVar2->buf).last + 2;
      puVar4 = nghttp2_cpymem((pnVar2->buf).last,(void *)*puVar3,puVar3[1]);
      (pnVar2->buf).last = puVar4;
    }
    if ((long)(pnVar2->buf).last - (long)(pnVar2->buf).pos != (frame->hd).length + 9) {
      __assert_fail("nghttp2_buf_len(buf) == NGHTTP2_FRAME_HDLEN + frame->hd.length",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_frame.c"
                    ,0x33b,"int nghttp2_frame_pack_origin(nghttp2_bufs *, nghttp2_extension *)");
    }
    bufs_local._4_4_ = 0;
  }
  return bufs_local._4_4_;
}

Assistant:

int nghttp2_frame_pack_origin(nghttp2_bufs *bufs, nghttp2_extension *frame) {
  nghttp2_buf *buf;
  nghttp2_ext_origin *origin;
  nghttp2_origin_entry *orig;
  size_t i;

  origin = frame->payload;

  buf = &bufs->head->buf;

  if (nghttp2_buf_avail(buf) < frame->hd.length) {
    return NGHTTP2_ERR_FRAME_SIZE_ERROR;
  }

  buf->pos -= NGHTTP2_FRAME_HDLEN;

  nghttp2_frame_pack_frame_hd(buf->pos, &frame->hd);

  for (i = 0; i < origin->nov; ++i) {
    orig = &origin->ov[i];
    nghttp2_put_uint16be(buf->last, (uint16_t)orig->origin_len);
    buf->last += 2;
    buf->last = nghttp2_cpymem(buf->last, orig->origin, orig->origin_len);
  }

  assert(nghttp2_buf_len(buf) == NGHTTP2_FRAME_HDLEN + frame->hd.length);

  return 0;
}